

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O1

char * MOS65XX_insn_name(csh handle,uint id)

{
  if (0x38 < id) {
    return (char *)0x0;
  }
  return InstructionInfoTable[id].name;
}

Assistant:

const char *MOS65XX_insn_name(csh handle, unsigned int id)
{
#ifdef CAPSTONE_DIET
	return NULL;
#else
	if (id >= ARR_SIZE(InstructionInfoTable)) {
		return NULL;
	}
	return InstructionInfoTable[id].name;
#endif
}